

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

bool __thiscall
DisasmReplayer::enqueue_create_descriptor_set_layout
          (DisasmReplayer *this,Hash hash,VkDescriptorSetLayoutCreateInfo *create_info,
          VkDescriptorSetLayout *layout)

{
  PFN_vkCreateDescriptorSetLayout p_Var1;
  VkResult VVar2;
  VkDevice pVVar3;
  VkDescriptorSetLayout_T *pVVar4;
  VkDescriptorSetLayout *layout_local;
  VkDescriptorSetLayoutCreateInfo *create_info_local;
  Hash hash_local;
  DisasmReplayer *this_local;
  
  layout_local = (VkDescriptorSetLayout *)create_info;
  create_info_local = (VkDescriptorSetLayoutCreateInfo *)hash;
  hash_local = (Hash)this;
  if (this->device == (VulkanDevice *)0x0) {
    pVVar4 = fake_handle<VkDescriptorSetLayout_T*>(hash);
    *layout = pVVar4;
  }
  else {
    fprintf(_stderr,"Fossilize INFO: Creating descriptor set layout 0%lX\n",hash);
    fflush(_stderr);
    p_Var1 = vkCreateDescriptorSetLayout;
    pVVar3 = Fossilize::VulkanDevice::get_device(this->device);
    VVar2 = (*p_Var1)(pVVar3,(VkDescriptorSetLayoutCreateInfo *)layout_local,
                      (VkAllocationCallbacks *)0x0,layout);
    if (VVar2 != VK_SUCCESS) {
      fprintf(_stderr,"Fossilize ERROR:  ... Failed!\n");
      fflush(_stderr);
      return false;
    }
    fprintf(_stderr,"Fossilize INFO:  ... Succeeded!\n");
    fflush(_stderr);
  }
  std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>::push_back
            (&this->layouts,layout);
  std::
  vector<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
  ::push_back(&this->set_layout_infos,(value_type *)&layout_local);
  return true;
}

Assistant:

bool enqueue_create_descriptor_set_layout(Hash hash, const VkDescriptorSetLayoutCreateInfo *create_info, VkDescriptorSetLayout *layout) override
	{
		if (device)
		{
			LOGI("Creating descriptor set layout 0%" PRIX64 "\n", hash);
			if (vkCreateDescriptorSetLayout(device->get_device(), create_info, nullptr, layout) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*layout = fake_handle<VkDescriptorSetLayout>(hash);

		layouts.push_back(*layout);
		set_layout_infos.push_back(create_info);
		return true;
	}